

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O0

void __thiscall
msgpack11::Value<(msgpack11::MsgPack::Type)4,_short>::dump
          (Value<(msgpack11::MsgPack::Type)4,_short> *this,string *out)

{
  string *out_local;
  Value<(msgpack11::MsgPack::Type)4,_short> *this_local;
  
  anon_unknown_0::dump(this->m_value,out);
  return;
}

Assistant:

void dump(std::string &out) const override { msgpack11::dump(m_value, out); }